

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O0

DetectorResults *
ZXing::DataMatrix::Detect(BitMatrix *image,bool tryHarder,bool tryRotate,bool isPure)

{
  bool bVar1;
  undefined1 uVar2;
  byte in_DL;
  DetectorResults *in_RDI;
  byte in_R8B;
  BitMatrix *in_stack_00000028;
  DetectorResult *result;
  BitMatrix *in_stack_00000228;
  undefined1 in_stack_00000276;
  undefined1 in_stack_00000277;
  BitMatrix *in_stack_00000278;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  
  DetectPure(in_stack_00000028);
  bVar1 = DetectorResult::isValid((DetectorResult *)0x26f333);
  if ((!bVar1) && ((in_R8B & 1) == 0)) {
    DetectNew(in_stack_00000278,(bool)in_stack_00000277,(bool)in_stack_00000276);
    DetectorResult::operator=
              (in_RDI,(DetectorResult *)
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    DetectorResult::~DetectorResult((DetectorResult *)0x26f390);
  }
  uVar2 = DetectorResult::isValid((DetectorResult *)0x26f3bf);
  if (((!(bool)uVar2) && ((in_DL & 1) != 0)) && ((in_R8B & 1) == 0)) {
    DetectOld(in_stack_00000228);
    DetectorResult::operator=(in_RDI,(DetectorResult *)CONCAT17(uVar2,in_stack_ffffffffffffff38));
    DetectorResult::~DetectorResult((DetectorResult *)0x26f410);
  }
  return in_RDI;
}

Assistant:

DetectorResults Detect(const BitMatrix& image, bool tryHarder, bool tryRotate, bool isPure)
{
#ifdef __cpp_impl_coroutine
	// First try the very fast DetectPure() path. Also because DetectNew() generally fails with pure module size 1 symbols
	// TODO: implement a tryRotate version of DetectPure, see #590.
	if (auto r = DetectPure(image); r.isValid())
		co_yield std::move(r);
	else if (!isPure) { // If r.isValid() then there is no point in looking for more (no-pure) symbols
		bool found = false;
		for (auto&& r : DetectNew(image, tryHarder, tryRotate)) {
			found = true;
			co_yield std::move(r);
		}
		if (!found && tryHarder) {
			if (auto r = DetectOld(image); r.isValid())
				co_yield std::move(r);
		}
	}
#else
	auto result = DetectPure(image);
	if (!result.isValid() && !isPure)
		result = DetectNew(image, tryHarder, tryRotate);
	if (!result.isValid() && tryHarder && !isPure)
		result = DetectOld(image);
	return result;
#endif
}